

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_shift.c
# Opt level: O0

int BN_rshift(BIGNUM *r,BIGNUM *a,int n)

{
  byte bVar1;
  int iVar2;
  BIGNUM *pBVar3;
  ulong uVar4;
  unsigned_long tmp;
  unsigned_long l;
  unsigned_long *f;
  unsigned_long *t;
  int rb;
  int lb;
  int nw;
  int j;
  int i;
  undefined8 in_stack_ffffffffffffffa8;
  BIGNUM *in_stack_ffffffffffffffb0;
  ulong local_48;
  ulong *local_40;
  ulong *local_38;
  int local_20;
  int local_4;
  
  if (n < 0) {
    local_4 = 0;
  }
  else {
    local_20 = n / 0x40;
    bVar1 = (byte)(n % 0x40);
    if ((local_20 < a->top) && (a->top != 0)) {
      iVar2 = BN_num_bits(a);
      if (r == a) {
        if (n == 0) {
          return 1;
        }
      }
      else {
        r->neg = a->neg;
        pBVar3 = bn_wexpand(in_stack_ffffffffffffffb0,
                            (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
        if (pBVar3 == (BIGNUM *)0x0) {
          return 0;
        }
      }
      local_40 = a->d + local_20;
      local_38 = r->d;
      local_20 = a->top - local_20;
      r->top = ((iVar2 - n) + 0x3f) / 0x40;
      if (n % 0x40 == 0) {
        for (; local_20 != 0; local_20 = local_20 + -1) {
          *local_38 = *local_40;
          local_40 = local_40 + 1;
          local_38 = local_38 + 1;
        }
      }
      else {
        local_48 = *local_40;
        while( true ) {
          local_20 = local_20 + -1;
          local_40 = local_40 + 1;
          if (local_20 == 0) break;
          uVar4 = local_48 >> (bVar1 & 0x3f);
          local_48 = *local_40;
          *local_38 = uVar4 | local_48 << (0x40 - bVar1 & 0x3f);
          local_38 = local_38 + 1;
        }
        local_48 = local_48 >> (bVar1 & 0x3f);
        if (local_48 != 0) {
          *local_38 = local_48;
        }
      }
      local_4 = 1;
    }
    else {
      BN_zero_ex((BIGNUM *)r);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int BN_rshift(BIGNUM *r, const BIGNUM *a, int n)
{
    int i, j, nw, lb, rb;
    BN_ULONG *t, *f;
    BN_ULONG l, tmp;

    bn_check_top(r);
    bn_check_top(a);

    if (n < 0) {
        //BNerr(BN_F_BN_RSHIFT, BN_R_INVALID_SHIFT);
        return 0;
    }

    nw = n / BN_BITS2;
    rb = n % BN_BITS2;
    lb = BN_BITS2 - rb;
    if (nw >= a->top || a->top == 0) {
        BN_zero(r);
        return (1);
    }
    i = (BN_num_bits(a) - n + (BN_BITS2 - 1)) / BN_BITS2;
    if (r != a) {
        r->neg = a->neg;
        if (bn_wexpand(r, i) == NULL)
            return (0);
    } else {
        if (n == 0)
            return 1;           /* or the copying loop will go berserk */
    }

    f = &(a->d[nw]);
    t = r->d;
    j = a->top - nw;
    r->top = i;

    if (rb == 0) {
        for (i = j; i != 0; i--)
            *(t++) = *(f++);
    } else {
        l = *(f++);
        for (i = j - 1; i != 0; i--) {
            tmp = (l >> rb) & BN_MASK2;
            l = *(f++);
            *(t++) = (tmp | (l << lb)) & BN_MASK2;
        }
        if ((l = (l >> rb) & BN_MASK2))
            *(t) = l;
    }
    bn_check_top(r);
    return (1);
}